

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TimeZoneFormat::parseDefaultOffsetFields
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UChar separator,int32_t *parsedLen
          )

{
  char16_t cVar1;
  int32_t iVar2;
  int local_48;
  int local_44;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int32_t len;
  int32_t idx;
  int32_t max;
  int32_t *parsedLen_local;
  UChar separator_local;
  UnicodeString *pUStack_20;
  int32_t start_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  _idx = parsedLen;
  parsedLen_local._2_2_ = separator;
  parsedLen_local._4_4_ = start;
  pUStack_20 = text;
  text_local = (UnicodeString *)this;
  len = UnicodeString::length(text);
  hour = parsedLen_local._4_4_;
  min = 0;
  local_44 = 0;
  local_48 = 0;
  *_idx = 0;
  iVar2 = parseOffsetFieldWithLocalizedDigits
                    (this,pUStack_20,parsedLen_local._4_4_,'\x01','\x02',0,0x17,&min);
  if ((((min != 0) && (hour = min + hour, hour + 1 < len)) &&
      (cVar1 = UnicodeString::charAt(pUStack_20,hour), cVar1 == parsedLen_local._2_2_)) &&
     (((local_44 = parseOffsetFieldWithLocalizedDigits
                             (this,pUStack_20,hour + 1,'\x02','\x02',0,0x3b,&min), min != 0 &&
       (hour = min + 1 + hour, hour + 1 < len)) &&
      ((cVar1 = UnicodeString::charAt(pUStack_20,hour), cVar1 == parsedLen_local._2_2_ &&
       (local_48 = parseOffsetFieldWithLocalizedDigits
                             (this,pUStack_20,hour + 1,'\x02','\x02',0,0x3b,&min), min != 0)))))) {
    hour = min + 1 + hour;
  }
  if (hour == parsedLen_local._4_4_) {
    this_local._4_4_ = 0;
  }
  else {
    *_idx = hour - parsedLen_local._4_4_;
    this_local._4_4_ = iVar2 * 3600000 + local_44 * 60000 + local_48 * 1000;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
TimeZoneFormat::parseDefaultOffsetFields(const UnicodeString& text, int32_t start, UChar separator, int32_t& parsedLen) const {
    int32_t max = text.length();
    int32_t idx = start;
    int32_t len = 0;
    int32_t hour = 0, min = 0, sec = 0;

    parsedLen = 0;

    do {
        hour = parseOffsetFieldWithLocalizedDigits(text, idx, 1, 2, 0, MAX_OFFSET_HOUR, len);
        if (len == 0) {
            break;
        }
        idx += len;

        if (idx + 1 < max && text.charAt(idx) == separator) {
            min = parseOffsetFieldWithLocalizedDigits(text, idx + 1, 2, 2, 0, MAX_OFFSET_MINUTE, len);
            if (len == 0) {
                break;
            }
            idx += (1 + len);

            if (idx + 1 < max && text.charAt(idx) == separator) {
                sec = parseOffsetFieldWithLocalizedDigits(text, idx + 1, 2, 2, 0, MAX_OFFSET_SECOND, len);
                if (len == 0) {
                    break;
                }
                idx += (1 + len);
            }
        }
    } while (FALSE);

    if (idx == start) {
        return 0;
    }

    parsedLen = idx - start;
    return hour * MILLIS_PER_HOUR + min * MILLIS_PER_MINUTE + sec * MILLIS_PER_SECOND;
}